

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataDrawBuffersCase::iterate
          (FragDataDrawBuffersCase *this)

{
  pointer pbVar1;
  ostringstream *poVar2;
  RenderContext *renderCtx;
  code *pcVar3;
  value_type *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ObjectWrapper *pOVar10;
  undefined4 extraout_var_03;
  NotSupportedError *this_00;
  TestError *this_01;
  byte bVar11;
  RGBA expectedColor;
  char *description;
  undefined4 uVar12;
  long lVar13;
  long *plVar14;
  uint uVar15;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  void *data;
  bool bVar20;
  uint uVar21;
  Vec4 VVar22;
  Surface result;
  deUint8 indices [6];
  float positions [8];
  float colors [16];
  Renderbuffer colorBuf0;
  Framebuffer fbo;
  deUint32 drawBuffers [2];
  Renderbuffer colorBuf1;
  ShaderProgram program;
  undefined4 local_42c;
  Surface local_420;
  FragDataDrawBuffersCase *local_400;
  long local_3f8;
  undefined1 local_3f0 [8];
  char *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e0;
  undefined8 uStack_3d0;
  TextureFormat local_3c8;
  long local_3c0;
  long local_3b8 [2];
  uint local_3a8 [2];
  value_type vStack_3a0;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ObjectWrapper local_368;
  ObjectWrapper local_350;
  undefined1 local_338 [8];
  value_type local_330;
  int local_310;
  VertexComponentType local_308;
  VertexComponentConversion VStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  char **local_2f0;
  PrimitiveType local_2e8;
  long *local_2e0 [2];
  long local_2d0 [3];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  uint *local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [104];
  ios_base local_220 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_208;
  undefined1 local_1e8 [208];
  ObjectWrapper local_118;
  ShaderProgram local_100;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_400 = this;
  memset(local_298,0,0xac);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8[8] = 0;
  local_1e8._9_7_ = 0;
  local_1e8[0x10] = 0;
  local_1e8._17_8_ = 0;
  local_3e8 = aStack_3e0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  __x = &(((VertexArrayBinding *)local_338)->binding).name;
  local_338._0_4_ = TYPE_LOCATION;
  paVar4 = &(((VertexArrayBinding *)local_338)->binding).name.field_2;
  local_330._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__x,local_3e8,local_3e8 + aStack_3e0._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + (ulong)(uint)local_338._0_4_ * 0x18),__x);
  puVar5 = &local_420.m_pixels.m_cap;
  local_420._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_420,
             "varying mediump vec4 v_color;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData[u_index] = v_color;\n}\n"
             ,"");
  local_3a8[0] = 1;
  vStack_3a0._M_dataplus._M_p = (pointer)&vStack_3a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vStack_3a0,local_420._0_8_,(long)local_420.m_pixels.m_ptr + local_420._0_8_)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + (ulong)local_3a8[0] * 0x18),&vStack_3a0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_3a0._M_dataplus._M_p != &vStack_3a0.field_2) {
    operator_delete(vStack_3a0._M_dataplus._M_p,vStack_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined8 *)local_420._0_8_ != puVar5) {
    operator_delete((void *)local_420._0_8_,local_420.m_pixels.m_cap + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar4) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if (local_3e8 != aStack_3e0._M_local_buf + 8) {
    operator_delete(local_3e8,aStack_3e0._8_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_208);
  lVar13 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar7);
  local_42c = 0xffffffff;
  if (local_100.m_program.m_info.linkOk == true) {
    local_42c = (**(code **)(lVar13 + 0xb48))(local_100.m_program.m_program,"u_index");
  }
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_350,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar9);
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_368,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar9);
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_118,(Functions *)CONCAT44(extraout_var_02,iVar7),pOVar9);
  aStack_3e0._8_8_ = 0x3f800000bf800000;
  uStack_3d0 = 0x3f8000003f800000;
  local_3e8 = (char *)0xbf800000bf800000;
  aStack_3e0._M_allocated_capacity = 0xbf8000003f800000;
  local_378 = 0x3f80000000000000;
  uStack_370 = 0x3f80000000000000;
  vStack_3a0.field_2._8_8_ = 0x3f80000000000000;
  uStack_380 = 0x3f80000000000000;
  vStack_3a0._M_string_length = 0x3f80000000000000;
  vStack_3a0.field_2._M_allocated_capacity = 0x3f80000000000000;
  local_3a8[0] = 0;
  local_3a8[1] = 0x3f800000;
  vStack_3a0._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_3f0._4_2_ = 0x301;
  local_3f0._0_4_ = 0x2020100;
  local_420._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"a_position","");
  local_298._0_4_ = 1;
  pbVar1 = (pointer)(local_288 + 8);
  local_298._8_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_298 + 8),local_420._0_8_,
             (long)local_420.m_pixels.m_ptr + local_420._0_8_);
  local_288._24_4_ = 0;
  local_338._0_4_ = local_298._0_4_;
  local_330._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(((VertexArrayBinding *)local_338)->binding).name,local_298._8_8_,
             (pointer)((long)&((_Alloc_hider *)local_298._8_8_)->_M_p + local_288._0_8_));
  local_310 = local_288._24_4_;
  local_308 = VTX_COMP_FLOAT;
  VStack_304 = VTX_COMP_CONVERT_NONE;
  iStack_300 = 2;
  iStack_2fc = 4;
  local_2f8 = 0;
  local_2f0 = &local_3e8;
  if ((pointer)local_298._8_8_ != pbVar1) {
    operator_delete((void *)local_298._8_8_,(ulong)(local_288._8_8_ + 1));
  }
  local_3c8 = (TextureFormat)local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"a_color","");
  local_298._0_4_ = 1;
  local_298._8_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_298 + 8),local_3c8,local_3c0 + (long)local_3c8);
  local_288._24_4_ = 0;
  local_2e8 = local_298._0_4_;
  plVar14 = local_2d0;
  local_2e0[0] = plVar14;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e0,local_298._8_8_,
             (pointer)((long)&((_Alloc_hider *)local_298._8_8_)->_M_p + local_288._0_8_));
  local_2d0[2]._0_4_ = local_288._24_4_;
  local_2b8 = 8;
  uStack_2b0 = 0x400000004;
  local_2a8 = 0;
  local_2a0 = local_3a8;
  if ((pointer)local_298._8_8_ != pbVar1) {
    operator_delete((void *)local_298._8_8_,(ulong)(local_288._8_8_ + 1));
  }
  if (local_3c8 != (TextureFormat)local_3b8) {
    operator_delete((void *)local_3c8,local_3b8[0] + 1);
  }
  if ((undefined8 *)local_420._0_8_ != puVar5) {
    operator_delete((void *)local_420._0_8_,local_420.m_pixels.m_cap + 1);
  }
  glu::operator<<(((local_400->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    (**(code **)(lVar13 + 0x78))(0x8d40,local_350.m_object);
    uVar12 = 0x8ce0;
    bVar6 = true;
    do {
      bVar20 = bVar6;
      pOVar10 = &local_118;
      if (bVar20) {
        pOVar10 = &local_368;
      }
      dVar8 = pOVar10->m_object;
      (**(code **)(lVar13 + 0xa0))(0x8d41,dVar8);
      (**(code **)(lVar13 + 0x1238))(0x8d41,0x8058,0x80,0x80);
      (**(code **)(lVar13 + 0x688))(0x8d40,uVar12,0x8d41,dVar8);
      uVar12 = 0x8ce1;
      bVar6 = false;
    } while (bVar20);
    iVar7 = (**(code **)(lVar13 + 0x170))(0x8d40);
    if (iVar7 == 0x8cd5) {
      local_298._0_8_ = (pointer)0x8ce100008ce0;
      (**(code **)(lVar13 + 0x560))(2);
      pcVar3 = *(code **)(lVar13 + 0x1a8);
      local_420.m_width = 0xff0000ff;
      VVar22 = tcu::RGBA::toVec((RGBA *)&local_420);
      (*pcVar3)(VVar22.m_data[0],VVar22.m_data._8_8_,0x1800,0,local_298);
      pcVar3 = *(code **)(lVar13 + 0x1a8);
      local_420.m_width = -0xffff01;
      VVar22 = tcu::RGBA::toVec((RGBA *)&local_420);
      (*pcVar3)(VVar22.m_data[0],VVar22.m_data._8_8_,0x1800,1,local_298);
      (**(code **)(lVar13 + 0x1a00))(0,0,0x80,0x80);
      (**(code **)(lVar13 + 0x1680))(local_100.m_program.m_program);
      dVar8 = (**(code **)(lVar13 + 0x800))();
      glu::checkError(dVar8,"Setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                      ,0x131);
      local_298._0_8_ = ((local_400->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      poVar2 = (ostringstream *)(local_298 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      local_3f8 = lVar13;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Drawing to attachments 0 and 1, expecting only attachment 0 to change.",0x46);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_220);
      uVar16 = 0;
      bVar6 = true;
      do {
        bVar20 = bVar6;
        (**(code **)(local_3f8 + 0x14f0))(local_42c,uVar16);
        local_298._0_8_ = (pointer)0x600000000;
        local_298._8_8_ = local_298._8_8_ & 0xffffffff00000000;
        local_288._0_8_ = (pointer)local_3f0;
        glu::draw(renderCtx,local_100.m_program.m_program,2,(VertexArrayBinding *)local_338,
                  (PrimitiveList *)local_298,(DrawUtilCallback *)0x0);
        uVar16 = 1;
        bVar6 = false;
      } while (bVar20);
      dVar8 = (**(code **)(local_3f8 + 0x800))();
      glu::checkError(dVar8,"Rendering failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                      ,0x13b);
      tcu::Surface::Surface(&local_420,0x80,0x80);
      iVar7 = (*renderCtx->_vptr_RenderContext[4])();
      lVar13 = CONCAT44(extraout_var_03,iVar7);
      uVar18 = 0x1000000 << (8U - (char)*(int *)(lVar13 + 0x14) & 0x1f);
      bVar11 = 8 - *(char *)(lVar13 + 8);
      uVar21 = 0;
      if (*(int *)(lVar13 + 0x14) < 1) {
        uVar18 = 0;
      }
      uVar17 = 0x100 << (8U - *(char *)(lVar13 + 0xc) & 0x1f) | 1 << (bVar11 & 0x1f);
      uVar18 = 0x10000 << (8U - *(char *)(lVar13 + 0x10) & 0x1f) | uVar17 | uVar18;
      uVar15 = 1 << (bVar11 & 0x1f) & 0xff;
      if (0xfd < uVar15) {
        uVar15 = 0xfe;
      }
      uVar17 = uVar17 >> 8 & 0xff;
      if (0xfd < uVar17) {
        uVar17 = 0xfe;
      }
      uVar19 = uVar18 >> 0x10 & 0xff;
      if (0xfd < uVar19) {
        uVar19 = 0xfe;
      }
      uVar18 = uVar18 >> 0x18;
      if (0xfd < uVar18) {
        uVar18 = 0xfe;
      }
      poVar2 = (ostringstream *)(local_298 + 8);
      bVar11 = 1;
      bVar6 = true;
      do {
        bVar20 = bVar6;
        local_298._0_8_ =
             ((local_400->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Verifying attachment ",0x15);
        std::ostream::operator<<(poVar2,uVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"...",3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_220);
        (**(code **)(local_3f8 + 0x1218))(uVar21 | 0x8ce0);
        local_3c8.order = RGBA;
        local_3c8.type = UNORM_INT8;
        data = (void *)local_420.m_pixels.m_cap;
        if ((void *)local_420.m_pixels.m_cap != (void *)0x0) {
          data = local_420.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_298,&local_3c8,local_420.m_width,local_420.m_height,1,
                   data);
        glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)local_298);
        dVar8 = (**(code **)(local_3f8 + 0x800))();
        glu::checkError(dVar8,"Reading pixels failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                        ,0x148);
        expectedColor.m_value = 0xff0000ff;
        if (bVar20) {
          expectedColor.m_value = 0xff00ff00;
        }
        bVar6 = compareSingleColor(((local_400->super_TestCase).super_TestCase.super_TestNode.
                                   m_testCtx)->m_log,&local_420,expectedColor,
                                   (RGBA)(uVar18 * 0x1000000 +
                                          (uVar19 << 0x10 | uVar17 << 8 | uVar15) + 0x1010101));
        bVar11 = bVar11 & bVar6;
        uVar21 = 1;
        bVar6 = false;
      } while (bVar20);
      description = "Image comparison failed";
      if (bVar11 != 0) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_400->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(bVar11 ^ 1),description);
      tcu::Surface::~Surface(&local_420);
      lVar13 = -0xa0;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -10;
        lVar13 = lVar13 + 0x50;
      } while (lVar13 != 0);
      glu::ObjectWrapper::~ObjectWrapper(&local_118);
      glu::ObjectWrapper::~ObjectWrapper(&local_368);
      glu::ObjectWrapper::~ObjectWrapper(&local_350);
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return STOP;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
               ,0x124);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,"Dynamic indexing of gl_FragData[] not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_298);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glu::ShaderProgram		program			(renderCtx, glu::ProgramSources()
															<< glu::VertexSource(
																"attribute highp vec4 a_position;\n"
																"attribute highp vec4 a_color;\n"
																"varying mediump vec4 v_color;\n"
																"void main (void)\n"
																"{\n"
																"	gl_Position = a_position;\n"
																"	v_color = a_color;\n"
																"}\n")
															<< glu::FragmentSource(
																"varying mediump vec4 v_color;\n"
																"uniform mediump int u_index;\n"
																"void main (void)\n"
																"{\n"
																"	gl_FragData[u_index] = v_color;\n"
																"}\n"));
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const int						width			= 128;
		const int						height			= 128;
		const int						indexLoc		= program.isOk() ? gl.getUniformLocation(program.getProgram(), "u_index") : -1;
		const glu::Framebuffer			fbo				(renderCtx);
		const glu::Renderbuffer			colorBuf0		(renderCtx);
		const glu::Renderbuffer			colorBuf1		(renderCtx);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
			throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32	rbo	= ndx == 0 ? *colorBuf0 : *colorBuf1;

			gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, width, height);
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+ndx, GL_RENDERBUFFER, rbo);
		}
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		{
			const deUint32 drawBuffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
			gl.drawBuffers(DE_LENGTH_OF_ARRAY(drawBuffers), &drawBuffers[0]);
		}

		gl.clearBufferfv(GL_COLOR, 0, tcu::RGBA::red().toVec().getPtr());
		gl.clearBufferfv(GL_COLOR, 1, tcu::RGBA::red().toVec().getPtr());

		gl.viewport		(0, 0, width, height);
		gl.useProgram	(program.getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		m_testCtx.getLog() << TestLog::Message << "Drawing to attachments 0 and 1, expecting only attachment 0 to change." << TestLog::EndMessage;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			gl.uniform1i(indexLoc, ndx);
			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(width, height);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				allOk		= true;

			for (int ndx = 0; ndx < 2; ndx++)
			{
				m_testCtx.getLog() << TestLog::Message << "Verifying attachment " << ndx << "..." << TestLog::EndMessage;

				gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
				glu::readPixels(renderCtx, 0, 0, result.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

				if (!compareSingleColor(m_testCtx.getLog(), result, ndx == 0 ? tcu::RGBA::green() : tcu::RGBA::red(), threshold))
					allOk = false;
			}

			m_testCtx.setTestResult(allOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}